

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall RandStrAltList::generate(RandStrAltList *this,wchar_t **dst)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined8 in_RSI;
  long in_RDI;
  RandStrNode *chi;
  int n;
  long *local_20;
  int local_14;
  
  uVar1 = rng_next();
  uVar2 = rand_range((ulong)uVar1,(long)*(int *)(in_RDI + 0x20));
  local_20 = *(long **)(in_RDI + 8);
  for (local_14 = (int)uVar2; local_14 != 0 && local_20 != (long *)0x0; local_14 = local_14 + -1) {
    local_20 = (long *)local_20[3];
  }
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x18))(local_20,in_RSI);
  }
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* pick one of our alternatives at random */
        int n = rand_range(rng_next(vmg0_), altCount);

        /* find it and generate it */
        RandStrNode *chi;
        for (chi = firstChild ; n != 0 && chi != 0 ;
             --n, chi = chi->nextSibling) ;

        /* generate the expression */
        if (chi != 0)
            chi->generate(vmg_ dst);
    }